

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O0

void test_bus_cooked(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  _Bool b;
  nng_socket s;
  
  nVar1 = nng_bus0_open((nng_socket *)&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x17d,"%s: expected success, got %s (%d)","nng_bus0_open(&s)",pcVar3,nVar1
                        );
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_raw((nng_socket)result_,(_Bool *)((long)&result__1 + 3));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x17e,"%s: expected success, got %s (%d)","nng_socket_raw(s, &b)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(byte)((result__1._3_1_ ^ 0xff) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                 ,0x17f,"%s","!b");
  nVar1 = nng_socket_close((nng_socket)result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x180,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_bus0_open_raw((nng_socket *)&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x183,"%s: expected success, got %s (%d)","nng_bus0_open_raw(&s)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_raw((nng_socket)result_,(_Bool *)((long)&result__1 + 3));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x184,"%s: expected success, got %s (%d)","nng_socket_raw(s, &b)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(byte)(result__1._3_1_ & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                 ,0x185,"%s","b");
  nVar1 = nng_socket_close((nng_socket)result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x186,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

static void
test_bus_cooked(void)
{
	nng_socket s;
	bool       b;

	NUTS_PASS(nng_bus0_open(&s));
	NUTS_PASS(nng_socket_raw(s, &b));
	NUTS_TRUE(!b);
	NUTS_CLOSE(s);

	// raw pub only differs in the option setting
	NUTS_PASS(nng_bus0_open_raw(&s));
	NUTS_PASS(nng_socket_raw(s, &b));
	NUTS_TRUE(b);
	NUTS_CLOSE(s);
}